

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

void __thiscall
lf::geometry::Parallelogram::Parallelogram
          (Parallelogram *this,Matrix<double,__1,_4,_0,__1,_4> *coords)

{
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>> *this_00;
  RealScalar RVar1;
  RealScalar RVar2;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  stringstream local_5d8 [8];
  stringstream ss;
  ostream local_5c8 [376];
  ColXpr local_450;
  ColXpr local_418;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_3e0;
  ColXpr local_368;
  ColXpr local_330;
  ColXpr local_2f8;
  ColXpr local_2c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_288;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_210;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_150;
  int local_44;
  Index local_40 [3];
  int local_24;
  Index local_20;
  Matrix<double,__1,_4,_0,__1,_4> *local_18;
  Matrix<double,__1,_4,_0,__1,_4> *coords_local;
  Parallelogram *this_local;
  
  local_18 = coords;
  coords_local = (Matrix<double,__1,_4,_0,__1,_4> *)this;
  Geometry::Geometry(&this->super_Geometry);
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_00dcd0c8;
  Eigen::Matrix<double,_-1,_4,_0,_-1,_4>::Matrix(&this->coords_,coords);
  local_20 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::rows
                       (&(this->coords_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>);
  local_24 = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_,&local_20,&local_24);
  local_40[0] = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::rows
                          (&(this->coords_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>);
  local_44 = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_inverse_gramian_,local_40,&local_44);
  this->integrationElement_ = 0.0;
  assertNonDegenerateQuad(&this->coords_,1e-08);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_2c0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_2f8,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>>::operator-
            (&local_288,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>> *)&local_2c0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> *)
             &local_2f8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_330,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,1);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const>>
  ::operator+(&local_210,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const>>
               *)&local_288,
              (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> *)
              &local_330);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_368,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const>>
  ::operator-(&local_150,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const>>
               *)&local_210,
              (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> *)
              &local_368);
  RVar1 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
                  *)&local_150);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_418,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
            (&local_450,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)&this->coords_,0);
  this_00 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>> *)&local_418;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>>::operator-
            (&local_3e0,this_00,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_> *)
             &local_450);
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>_>
                  *)&local_3e0);
  if (RVar1 < RVar2 * 1e-08) {
    init(this,(EVP_PKEY_CTX *)this_00);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_5d8);
  std::operator<<(local_5c8,"No parallelogram!");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,
             "(coords_.col(3) - coords_.col(2) + coords_.col(1) - coords_.col(0)) .norm() < 1.0E-8 * (coords_.col(2) - coords_.col(0)).norm()"
             ,&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
             ,&local_621);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_5f8,&local_620,0x10d,&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"false",&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
             ,&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"",&local_6b9);
  lf::base::AssertionFailed(&local_668,&local_690,0x10d,&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  abort();
}

Assistant:

Parallelogram::Parallelogram(Eigen::Matrix<double, Eigen::Dynamic, 4> coords)
    : coords_(std::move(coords)),
      jacobian_(coords_.rows(), 2),
      jacobian_inverse_gramian_(coords_.rows(), 2),
      integrationElement_(0) {
  // Check validity of geometry (non-zero area)
  assertNonDegenerateQuad(coords_);
  // Check parallelogram property
  LF_ASSERT_MSG(
      (coords_.col(3) - coords_.col(2) + coords_.col(1) - coords_.col(0))
              .norm() < 1.0E-8 * (coords_.col(2) - coords_.col(0)).norm(),
      "No parallelogram!");
  init();
}